

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  int i;
  ImGuiTable *table_00;
  ImGuiTableColumn *pIVar2;
  long in_RDI;
  bool menu_item_active;
  char *name;
  ImGuiTableColumn *other_column;
  int other_column_n;
  char *size_all_desc;
  bool can_resize;
  ImGuiTableColumn *column;
  int column_n;
  bool want_separator;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffac;
  uint uVar3;
  int local_3c;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    bVar1 = false;
    if ((*(char *)(in_RDI + 0x200) < '\0') ||
       (*(int *)(in_RDI + 0x74) <= (int)*(char *)(in_RDI + 0x200))) {
      i = -1;
    }
    else {
      i = (int)*(char *)(in_RDI + 0x200);
    }
    if (i == -1) {
      table_00 = (ImGuiTable *)0x0;
    }
    else {
      table_00 = (ImGuiTable *)
                 ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),i)
      ;
    }
    if ((*(uint *)(in_RDI + 4) & 1) != 0) {
      if (table_00 != (ImGuiTable *)0x0) {
        uVar3 = in_stack_ffffffffffffff9c & 0xffffff;
        if ((table_00->ID & 0x20) == 0) {
          uVar3 = CONCAT13(*(bool *)((long)&table_00->VisibleMaskByIndex + 2),
                           (int3)in_stack_ffffffffffffff9c);
        }
        in_stack_ffffffffffffff9c = uVar3;
        LocalizeGetMsg(ImGuiLocKey_TableSizeOne);
        bVar1 = MenuItem((char *)table_00,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),false
                         ,false);
        if (bVar1) {
          TableSetColumnWidthAutoSingle(table_00,in_stack_ffffffffffffff9c);
        }
      }
      if ((*(char *)(in_RDI + 0x1f2) == *(char *)(in_RDI + 0x1f1)) &&
         ((*(uint *)(in_RDI + 4) & 0xe000) != 0x4000)) {
        LocalizeGetMsg(ImGuiLocKey_TableSizeAllFit);
      }
      else {
        LocalizeGetMsg(ImGuiLocKey_TableSizeAllDefault);
      }
      bVar1 = MenuItem((char *)table_00,
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),false,
                       false);
      if (bVar1) {
        TableSetColumnWidthAutoAll(table_00);
      }
      bVar1 = true;
    }
    if ((*(uint *)(in_RDI + 4) & 2) != 0) {
      LocalizeGetMsg(ImGuiLocKey_TableResetOrder);
      bVar1 = MenuItem((char *)table_00,
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),false,
                       false);
      if (bVar1) {
        *(undefined1 *)(in_RDI + 0x213) = 1;
      }
      bVar1 = true;
    }
    if ((*(uint *)(in_RDI + 4) & 4) != 0) {
      if (bVar1) {
        Separator();
      }
      PushItemFlag((ImGuiItemFlags)((ulong)table_00 >> 0x20),SUB81((ulong)table_00 >> 0x18,0));
      for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x74); local_3c = local_3c + 1) {
        pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_3c);
        if ((pIVar2->Flags & 1U) == 0) {
          TableGetColumnName((ImGuiTable *)CONCAT44(in_stack_ffffffffffffffac,i),
                             (int)((ulong)table_00 >> 0x20));
          uVar3 = CONCAT13(-((pIVar2->Flags & 0x80) == 0),(int3)in_stack_ffffffffffffffac) &
                  0x1ffffff;
          if (((pIVar2->IsUserEnabled & 1U) != 0) && (*(char *)(in_RDI + 0x1f1) < '\x02')) {
            uVar3 = in_stack_ffffffffffffffac & 0xffffff;
          }
          bVar1 = MenuItem((char *)table_00,
                           (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           false,false);
          in_stack_ffffffffffffffac = uVar3;
          if (bVar1) {
            pIVar2->IsUserEnabledNextFrame = (bool)((pIVar2->IsUserEnabled ^ 0xffU) & 1);
          }
        }
      }
      PopItemFlag();
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableSizeOne), NULL, false, can_resize)) // "###SizeOne"
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllFit);        // "###SizeAll" All fixed
        else
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllDefault);    // "###SizeAll" All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableResetOrder), NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            if (other_column->Flags & ImGuiTableColumnFlags_Disabled)
                continue;

            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsUserEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsUserEnabled, menu_item_active))
                other_column->IsUserEnabledNextFrame = !other_column->IsUserEnabled;
        }
        PopItemFlag();
    }
}